

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O3

bool __thiscall dxil_spv::CFGStructurizer::find_loops(CFGStructurizer *this,uint pass)

{
  pointer *pppCVar1;
  iterator __position;
  pointer ppCVar2;
  pointer ppCVar3;
  bool bVar4;
  LoggingCallback p_Var5;
  void *pvVar6;
  CFGNode *pCVar7;
  CFGNode *pCVar8;
  iterator __end3;
  pointer ppCVar9;
  pointer ppCVar10;
  long lVar11;
  iterator __begin3;
  byte bVar12;
  CFGNode *node;
  LoopAnalysis result;
  LoopMergeAnalysis merge_result;
  char buffer [4096];
  CFGNode *local_10f0;
  uint local_10e4;
  LoopAnalysis local_10e0;
  LoopMergeAnalysis local_1050;
  char local_1038 [4104];
  
  lVar11 = (long)(this->forward_post_visit_order).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->forward_post_visit_order).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar11 != 0) {
    lVar11 = lVar11 >> 3;
    local_10e4 = pass;
    do {
      local_10f0 = (this->forward_post_visit_order).
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar11 + -1];
      if ((local_10f0->freeze_structured_analysis == true) && (local_10f0->merge == Loop)) {
        pCVar7 = local_10f0->loop_merge_block;
        __position._M_current =
             (pCVar7->headers).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pCVar7->headers).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>::
          _M_realloc_insert<dxil_spv::CFGNode*const&>
                    ((vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>
                      *)&pCVar7->headers,__position,&local_10f0);
        }
        else {
          *__position._M_current = local_10f0;
          pppCVar1 = &(pCVar7->headers).
                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppCVar1 = *pppCVar1 + 1;
        }
      }
      else {
        bVar4 = CFGNode::has_pred_back_edges(local_10f0);
        if (bVar4) {
          local_10f0->merge = Loop;
          analyze_loop(&local_10e0,this,local_10f0);
          if (local_10e0.dominated_continue_exit.
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_10e0.dominated_continue_exit.
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            __assert_fail("result.dominated_continue_exit.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                          ,0x1851,"bool dxil_spv::CFGStructurizer::find_loops(unsigned int)");
          }
          if (((((long)local_10e0.dominated_exit.
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_10e0.dominated_exit.
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start == 8) &&
               (local_10e0.non_dominated_exit.
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_10e0.non_dominated_exit.
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish)) &&
              (local_10e0.inner_dominated_exit.
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               local_10e0.inner_dominated_exit.
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_finish)) &&
             ((local_10e0.direct_exits.
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               local_10e0.direct_exits.
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_finish &&
              (local_10e0.inner_direct_exits.
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               local_10e0.inner_direct_exits.
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_finish)))) {
            pCVar7 = *local_10e0.dominated_exit.
                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (pCVar7->immediate_dominator == (CFGNode *)0x0) {
              bVar4 = false;
            }
            else {
              bVar4 = CFGNode::dominates(pCVar7->immediate_dominator,local_10f0->pred_back_edge);
              pCVar7 = *local_10e0.dominated_exit.
                        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            pCVar7 = get_innermost_loop_header_for(this,local_10f0,pCVar7);
            if (local_10f0 == pCVar7) {
              bVar12 = 1;
            }
            else {
              bVar12 = bVar4 & (pCVar7->pred_back_edge->succ).
                               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_start ==
                               (pCVar7->pred_back_edge->succ).
                               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
            }
          }
          else {
            bVar12 = 0;
          }
          ppCVar2 = local_10e0.dominated_exit.
                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if ((bVar12 == 0) &&
             ((local_10f0->pred_back_edge->succ).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (local_10f0->pred_back_edge->succ).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish)) {
            bVar4 = true;
            for (ppCVar10 = local_10e0.dominated_exit.
                            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                ppCVar3 = local_10e0.non_dominated_exit.
                          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                ppCVar9 = local_10e0.non_dominated_exit.
                          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start, ppCVar10 != ppCVar2;
                ppCVar10 = ppCVar10 + 1) {
              if (bVar4 == false) {
                bVar4 = false;
              }
              else {
                bVar4 = loop_exit_supports_infinite_loop(this,local_10f0,*ppCVar10);
              }
            }
            for (; ppCVar2 = local_10e0.inner_dominated_exit.
                             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                ppCVar10 = local_10e0.inner_dominated_exit.
                           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_start, ppCVar9 != ppCVar3;
                ppCVar9 = ppCVar9 + 1) {
              if (bVar4 == false) {
                bVar4 = false;
              }
              else {
                bVar4 = loop_exit_supports_infinite_loop(this,local_10f0,*ppCVar9);
              }
            }
            for (; ppCVar3 = local_10e0.direct_exits.
                             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                ppCVar9 = local_10e0.direct_exits.
                          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start, ppCVar10 != ppCVar2;
                ppCVar10 = ppCVar10 + 1) {
              if (bVar4 == false) {
                bVar4 = false;
              }
              else {
                bVar4 = loop_exit_supports_infinite_loop(this,local_10f0,*ppCVar10);
              }
            }
            for (; ppCVar2 = local_10e0.inner_direct_exits.
                             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                ppCVar10 = local_10e0.inner_direct_exits.
                           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_start, ppCVar9 != ppCVar3;
                ppCVar9 = ppCVar9 + 1) {
              if (bVar4 == false) {
                bVar4 = false;
              }
              else {
                bVar4 = loop_exit_supports_infinite_loop(this,local_10f0,*ppCVar9);
              }
            }
            for (; ppCVar10 != ppCVar2; ppCVar10 = ppCVar10 + 1) {
              if (bVar4 == false) {
                bVar4 = false;
              }
              else {
                bVar4 = loop_exit_supports_infinite_loop(this,local_10f0,*ppCVar10);
              }
            }
            if (bVar4 == false) goto LAB_0013f3b9;
LAB_0013f382:
            local_10f0->loop_merge_block = (CFGNode *)0x0;
LAB_0013f53b:
            bVar4 = true;
          }
          else {
LAB_0013f3b9:
            if (((local_10e0.dominated_exit.
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  local_10e0.dominated_exit.
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish) &&
                (local_10e0.inner_dominated_exit.
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start ==
                 local_10e0.inner_dominated_exit.
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) &&
               (local_10e0.non_dominated_exit.
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_10e0.non_dominated_exit.
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_0013f382;
            if ((((long)local_10e0.dominated_exit.
                        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_10e0.dominated_exit.
                        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_start == 8) &&
                (local_10e0.non_dominated_exit.
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start ==
                 local_10e0.non_dominated_exit.
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) &&
               (local_10e0.inner_dominated_exit.
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_10e0.inner_dominated_exit.
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish)) {
              if (((local_10e0.direct_exits.
                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    local_10e0.direct_exits.
                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish) ||
                  (pCVar7 = find_common_post_dominator(&local_10e0.direct_exits),
                  pCVar7 == (CFGNode *)0x0)) ||
                 ((pCVar8 = *local_10e0.dominated_exit.
                             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                             ._M_impl.super__Vector_impl_data._M_start, pCVar8 != pCVar7 &&
                  (((this->reachability_bitset).
                    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start
                    [(ulong)(this->reachability_stride * pCVar8->forward_post_visit_order) +
                     (ulong)(pCVar7->forward_post_visit_order >> 5)] >>
                    (pCVar7->forward_post_visit_order & 0x1f) & 1) == 0)))) {
                pCVar7 = *local_10e0.dominated_exit.
                          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              }
              else {
                local_10f0->loop_ladder_block = pCVar8;
              }
              local_10f0->loop_merge_block = pCVar7;
LAB_0013f536:
              CFGNode::add_unique_header(pCVar7,local_10f0);
              goto LAB_0013f53b;
            }
            if (((local_10e0.dominated_exit.
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  local_10e0.dominated_exit.
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish) &&
                (local_10e0.inner_dominated_exit.
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start ==
                 local_10e0.inner_dominated_exit.
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) &&
               ((long)local_10e0.non_dominated_exit.
                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_10e0.non_dominated_exit.
                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start == 8)) {
              find_loops();
              goto LAB_0013f53b;
            }
            analyze_loop_merge(&local_1050,this,local_10f0,&local_10e0);
            pCVar8 = local_1050.dominated_merge;
            pCVar7 = local_1050.merge;
            if ((local_10e4 != 0) ||
               (bVar4 = rewrite_complex_loop_exits
                                  (this,local_10f0,local_1050.merge,&local_10e0.dominated_exit),
               !bVar4)) {
              if (pCVar7 != (CFGNode *)0x0) {
                bVar4 = CFGNode::can_loop_merge_to(local_10f0,pCVar7);
                if (!bVar4) {
                  if (pCVar8 == (CFGNode *)0x0) {
                    pCVar8 = local_10f0->pred_back_edge;
                    ppCVar2 = (pCVar8->succ).
                              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    if ((long)(pCVar8->succ).
                              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2 == 8) {
                      pCVar8 = create_ladder_block(this,pCVar8,*ppCVar2,".merge");
                    }
                    else {
                      pCVar8 = (CFGNode *)0x0;
                    }
                  }
                  local_10f0->loop_ladder_block = pCVar8;
                }
                local_10f0->loop_merge_block = pCVar7;
                goto LAB_0013f536;
              }
              p_Var5 = get_thread_log_callback();
              if (p_Var5 == (LoggingCallback)0x0) {
                find_loops();
              }
              else {
                builtin_strncpy(local_1038 + 0x20,"int ...\n",9);
                builtin_strncpy(local_1038 + 0x10," common merge po",0x10);
                builtin_strncpy(local_1038,"Failed to find a",0x10);
                pvVar6 = get_thread_log_callback_userdata();
                (*p_Var5)(pvVar6,Warn,local_1038);
              }
              goto LAB_0013f53b;
            }
            bVar4 = false;
          }
          if (local_10e0.dominated_continue_exit.
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            free_in_thread(local_10e0.dominated_continue_exit.
                           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_10e0.non_dominated_exit.
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            free_in_thread(local_10e0.non_dominated_exit.
                           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_10e0.inner_dominated_exit.
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            free_in_thread(local_10e0.inner_dominated_exit.
                           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_10e0.dominated_exit.
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            free_in_thread(local_10e0.dominated_exit.
                           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_10e0.inner_direct_exits.
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            free_in_thread(local_10e0.inner_direct_exits.
                           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_10e0.direct_exits.
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            free_in_thread(local_10e0.direct_exits.
                           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_start);
          }
          if (!bVar4) {
            return true;
          }
        }
      }
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  return false;
}

Assistant:

bool CFGStructurizer::find_loops(unsigned pass)
{
	for (auto index = forward_post_visit_order.size(); index; index--)
	{
		// Visit in reverse order so we resolve outer loops first,
		// this lets us detect ladder-breaking loops.
		auto *node = forward_post_visit_order[index - 1];

		if (node->freeze_structured_analysis)
		{
			// If we have a pre-created dummy loop for ladding breaking,
			// just propagate the header information and be done with it.
			if (node->merge == MergeType::Loop)
			{
				node->loop_merge_block->headers.push_back(node);
				continue;
			}
		}

		if (!node->has_pred_back_edges())
			continue;

		// There are back-edges here, this must be a loop header.
		node->merge = MergeType::Loop;

		auto result = analyze_loop(node);
		auto &dominated_exit = result.dominated_exit;
		auto &inner_dominated_exit = result.inner_dominated_exit;
		auto &non_dominated_exit = result.non_dominated_exit;

		// This should not come up here, and must be handled in transpose loops.
		assert(result.dominated_continue_exit.empty());

		// Detect infinite loop with an exit which is only in inner loop construct.
		// It is impossible to construct a merge block in this case since the merge targets,
		// so just merge to unreachable.
		bool force_infinite_loop = false;

		// If we have a trivial case where there is only one possible loop exit which we dominate,
		// we shouldn't consider it an infinite loop, but a merge.
		bool trivial_exit_loop = dominated_exit.size() == 1 && result.non_dominated_exit.empty() &&
		                         result.inner_dominated_exit.empty() && result.direct_exits.empty() &&
		                         result.inner_direct_exits.empty();

		if (trivial_exit_loop)
		{
			auto *candidate = dominated_exit.front();

			// Resolve some false positives. It's possible that a loop exit can be detected as inner,
			// but it's just a good merge candidate for an inner infinite loop.
			bool loop_exit_dominates_continue =
				candidate->immediate_dominator &&
			    candidate->immediate_dominator->dominates(node->pred_back_edge);

			// If we promoted inner header, this is not a trivial exit.
			const CFGNode *innermost_loop_header = get_innermost_loop_header_for(node, dominated_exit.front());
			if (node != innermost_loop_header)
			{
				// There are at least two scenarios where we have to be careful:
				// - If the innermost header has a edge out of continue block.
				//   If we still detect this as belong to inner loop, it must be the case.
				// - Also, only accept this as a trivial exit if the immediate dominator of exit also dominates
				//   continue block.
				if (!innermost_loop_header->pred_back_edge->succ.empty() || !loop_exit_dominates_continue)
					trivial_exit_loop = false;
			}
		}

		if (node->pred_back_edge->succ.empty() && !trivial_exit_loop)
		{
			force_infinite_loop = true;
			for (auto *e : result.dominated_exit)
				force_infinite_loop = force_infinite_loop && loop_exit_supports_infinite_loop(node, e);
			for (auto *e : result.non_dominated_exit)
				force_infinite_loop = force_infinite_loop && loop_exit_supports_infinite_loop(node, e);
			for (auto *e : result.inner_dominated_exit)
				force_infinite_loop = force_infinite_loop && loop_exit_supports_infinite_loop(node, e);
			for (auto *e : result.direct_exits)
				force_infinite_loop = force_infinite_loop && loop_exit_supports_infinite_loop(node, e);
			for (auto *e : result.inner_direct_exits)
				force_infinite_loop = force_infinite_loop && loop_exit_supports_infinite_loop(node, e);
		}

		if (force_infinite_loop ||
		    (dominated_exit.empty() && inner_dominated_exit.empty() && non_dominated_exit.empty()))
		{
			// There can be zero loop exits, i.e. infinite loop. This means we have no merge block.
			// We will invent a merge block to satisfy SPIR-V validator, and declare it as unreachable.
			node->loop_merge_block = nullptr;
			//LOGI("Loop without merge: %p (%s)\n", static_cast<const void *>(node), node->name.c_str());
		}
		else if (dominated_exit.size() == 1 && non_dominated_exit.empty() && inner_dominated_exit.empty())
		{
			CFGNode *direct_exit_pdom = nullptr;
			if (!result.direct_exits.empty())
				direct_exit_pdom = find_common_post_dominator(result.direct_exits);

			if (direct_exit_pdom && query_reachability(*dominated_exit.front(), *direct_exit_pdom))
			{
				node->loop_ladder_block = dominated_exit.front();
				node->loop_merge_block = direct_exit_pdom;
			}
			else
			{
				// Clean merge.
				// This is a unique merge block. There can be no other merge candidate.
				node->loop_merge_block = dominated_exit.front();
			}

			const_cast<CFGNode *>(node->loop_merge_block)->add_unique_header(node);
			//LOGI("Loop with simple merge: %p (%s) -> %p (%s)\n", static_cast<const void *>(node), node->name.c_str(),
			//     static_cast<const void *>(node->loop_merge_block), node->loop_merge_block->name.c_str());
		}
		else if (dominated_exit.empty() && inner_dominated_exit.empty() && non_dominated_exit.size() == 1)
		{
			// Single-escape merge.
			// It is unique, but we need workarounds later.
			auto *merge_block = non_dominated_exit.front();

			// We can make the non-dominated exit dominated by
			// adding a ladder block in-between. This allows us to merge the loop cleanly
			// before breaking out.
			auto *ladder = create_ladder_block(node, merge_block, ".merge");
			node->loop_ladder_block = nullptr;
			node->loop_merge_block = ladder;

			const_cast<CFGNode *>(node->loop_merge_block)->add_unique_header(node);
			//LOGI("Loop with ladder merge: %p (%s) -> %p (%s)\n", static_cast<const void *>(node), node->name.c_str(),
			//     static_cast<const void *>(node->loop_merge_block), node->loop_merge_block->name.c_str());
		}
		else
		{
			auto merge_result = analyze_loop_merge(node, result);
			auto *merge = merge_result.merge;
			auto *dominated_merge = merge_result.dominated_merge;

			if (pass == 0 && rewrite_complex_loop_exits(node, merge, dominated_exit))
				return true;

			if (!merge)
			{
				LOGW("Failed to find a common merge point ...\n");
			}
			else if (node->can_loop_merge_to(merge))
			{
				// Clean merge.
				// This is a unique merge block. There can be no other merge candidate.
				//LOGI("Loop with simple multi-exit merge: %p (%s) -> %p (%s)\n", static_cast<const void *>(node),
				//     node->name.c_str(), static_cast<const void *>(node->loop_merge_block),
				//     node->loop_merge_block->name.c_str());

				node->loop_merge_block = merge;
				const_cast<CFGNode *>(node->loop_merge_block)->add_unique_header(node);
			}
			else
			{
				if (!dominated_merge && node->pred_back_edge->succ.size() == 1)
				{
					// If continue block exits, and it still does not dominate, we should invent a ladder block
					// so we get one, otherwise splitting merge scopes will break.
					dominated_merge = create_ladder_block(node->pred_back_edge, node->pred_back_edge->succ.front(), ".merge");
				}

				// Single-escape merge.
				// It is unique, but we need workarounds later.
				//LOGI("Loop with ladder multi-exit merge: %p (%s) -> %p (%s)\n", static_cast<const void *>(node),
				//     node->name.c_str(), static_cast<const void *>(node->loop_merge_block),
				//     node->loop_merge_block->name.c_str());

				//if (dominated_merge)
				//{
					//LOGI("    Ladder block: %p (%s)\n", static_cast<const void *>(dominated_merge),
					//     dominated_merge->name.c_str());
				//}

				// We will use this block as a ladder.
				node->loop_ladder_block = dominated_merge;
				node->loop_merge_block = merge;

				const_cast<CFGNode *>(node->loop_merge_block)->add_unique_header(node);
			}
		}
	}

	return false;
}